

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void StopRPC(any *context)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_8_1_bc11688f *in_stack_00000010;
  once_flag *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)context);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!g_rpc_running",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
                  ,0x12d,"void StopRPC(const std::any &)");
  }
  std::call_once<StopRPC(std::any_const&)::__0>(in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StopRPC(const std::any& context)
{
    static std::once_flag g_rpc_stop_flag;
    // This function could be called twice if the GUI has been started with -server=1.
    assert(!g_rpc_running);
    std::call_once(g_rpc_stop_flag, [&]() {
        LogDebug(BCLog::RPC, "Stopping RPC\n");
        WITH_LOCK(g_deadline_timers_mutex, deadlineTimers.clear());
        DeleteAuthCookie();
        node::NodeContext& node = EnsureAnyNodeContext(context);
        // The notifications interface doesn't exist between initialization step 4a and 7.
        if (node.notifications) node.notifications->m_tip_block_cv.notify_all();
        LogDebug(BCLog::RPC, "RPC stopped.\n");
    });
}